

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O1

bool __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
isRecognized(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,int index)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  bool bVar5;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->promiseLock);
  if (iVar1 == 0) {
    p_Var4 = &(this->promiseByInteger)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = (this->promiseByInteger)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &p_Var4->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < index]) {
      if (index <= (int)p_Var3[1]._M_color) {
        p_Var2 = p_Var3;
      }
    }
    p_Var3 = &p_Var4->_M_header;
    if (((_Rb_tree_header *)p_Var2 != p_Var4) && (p_Var3 = p_Var2, index < (int)p_Var2[1]._M_color))
    {
      p_Var3 = &p_Var4->_M_header;
    }
    bVar5 = true;
    if ((_Rb_tree_header *)p_Var3 == p_Var4) {
      p_Var4 = &(this->usedPromiseByInteger)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (this->usedPromiseByInteger)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var2 = &p_Var4->_M_header;
      for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < index])
      {
        if (index <= (int)p_Var3[1]._M_color) {
          p_Var2 = p_Var3;
        }
      }
      p_Var3 = &p_Var4->_M_header;
      if (((_Rb_tree_header *)p_Var2 != p_Var4) &&
         (p_Var3 = p_Var2, index < (int)p_Var2[1]._M_color)) {
        p_Var3 = &p_Var4->_M_header;
      }
      bVar5 = (_Rb_tree_header *)p_Var3 != p_Var4;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->promiseLock);
    return bVar5;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

bool isRecognized(int index)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        auto fnd = promiseByInteger.find(index);
        if (fnd != promiseByInteger.end()) {
            return true;
        }
        auto fnd2 = usedPromiseByInteger.find(index);
        if (fnd2 != usedPromiseByInteger.end()) {
            return true;
        }
        return false;
    }